

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

optional<pbrt::LightLiSample> * __thiscall
pbrt::DistantLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,DistantLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  Float a;
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar12 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined8 in_XMM1_Qb;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  SampledSpectrum SVar16;
  Vector3<float> VVar17;
  Point3f PVar18;
  SampledSpectrum local_40;
  Tuple3<pbrt::Vector3,_float> local_30;
  
  local_40.values.values[3] = local_40.values.values[1];
  local_30.x = 0.0;
  local_30.y = 0.0;
  local_30.z = 1.0;
  VVar17 = Transform::operator()
                     (&(this->super_LightBase).renderFromLight,(Vector3<float> *)&local_30);
  auVar7._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = in_register_00001208;
  uVar1 = vmovlps_avx(auVar7._0_16_);
  local_40.values.values[2] = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  local_40.values.values[0] = (float)(int)uVar1;
  local_40.values.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  VVar17 = Normalize<float>((Vector3<float> *)&local_40);
  auVar8._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = in_register_00001208;
  PVar18 = LightSampleContext::p(&ctx);
  auVar9._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = in_register_00001208;
  a = this->scale;
  fVar2 = this->sceneRadius + this->sceneRadius;
  auVar5 = vmovshdup_avx(auVar8._0_16_);
  fVar3 = PVar18.super_Tuple3<pbrt::Point3,_float>.x +
          VVar17.super_Tuple3<pbrt::Vector3,_float>.x * fVar2;
  auVar6 = vmovshdup_avx(auVar9._0_16_);
  fVar4 = auVar6._0_4_ + auVar5._0_4_ * fVar2;
  fVar2 = PVar18.super_Tuple3<pbrt::Point3,_float>.z +
          fVar2 * VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12 = (undefined1  [56])0x0;
  SVar16 = DenselySampledSpectrum::Sample(&this->Lemit,&lambda);
  auVar10._0_8_ = SVar16.values.values._0_8_;
  auVar10._8_56_ = auVar12;
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = SVar16.values.values._8_8_;
  local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar5);
  auVar12 = (undefined1  [56])0x0;
  SVar16 = SampledSpectrum::operator*(&local_40,a);
  auVar11._0_8_ = SVar16.values.values._0_8_;
  auVar11._8_56_ = auVar12;
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = SVar16.values.values._8_8_;
  auVar5 = vmovlhps_avx(auVar11._0_16_,auVar6);
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  auVar13._4_4_ = fVar3;
  auVar13._0_4_ = fVar3;
  auVar13._8_4_ = fVar3;
  auVar13._12_4_ = fVar3;
  auVar14._4_4_ = fVar4;
  auVar14._0_4_ = fVar4;
  auVar14._8_4_ = fVar4;
  auVar14._12_4_ = fVar4;
  auVar15._4_4_ = fVar2;
  auVar15._0_4_ = fVar2;
  auVar15._8_4_ = fVar2;
  auVar15._12_4_ = fVar2;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  __return_storage_ptr__->set = true;
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar5;
  uVar1 = vmovlps_avx(auVar8._0_16_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
  auVar5 = vmovlhps_avx(auVar13,auVar14);
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar5;
  uVar1 = vmovlps_avx(auVar15);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<LightLiSample> SampleLi(LightSampleContext ctx, Point2f u,
                                           SampledWavelengths lambda,
                                           LightSamplingMode mode) const {
        Vector3f wi = Normalize(renderFromLight(Vector3f(0, 0, 1)));
        Point3f pOutside = ctx.p() + wi * (2 * sceneRadius);
        return LightLiSample(scale * Lemit.Sample(lambda), wi, 1,
                             Interaction(pOutside, &mediumInterface));
    }